

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::edit_distance::CreateUnifiedDiff
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *left,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *right,size_t context)

{
  pointer pEVar1;
  list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_> *plVar2;
  EditType EVar3;
  char edit;
  ulong uVar4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  _List_node_base *p_Var9;
  ulong uVar10;
  size_t sVar11;
  bool bVar12;
  ulong local_270;
  long local_268;
  Hunk hunk;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  edits;
  stringstream ss;
  ostream local_1a8 [376];
  
  CalculateOptimalEdits(&edits,left,right);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  plVar2 = &hunk.hunk_;
  local_270 = 0;
  uVar10 = 0;
  local_268 = 0;
  do {
    uVar7 = (long)edits.
                  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)edits.
                  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2;
    if (uVar7 <= uVar10) {
LAB_00114da1:
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::
      _Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
      ::~_Vector_base(&edits.
                       super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                     );
      return __return_storage_ptr__;
    }
    lVar8 = local_270 << 5;
    uVar4 = local_270;
    for (lVar6 = 0; uVar7 - uVar10 != lVar6; lVar6 = lVar6 + 1) {
      if (edits.
          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar10 + lVar6] != kMatch) {
        uVar7 = uVar10 + lVar6;
        break;
      }
      uVar4 = uVar4 + 1;
      lVar8 = lVar8 + 0x20;
    }
    uVar10 = uVar7;
    local_270 = local_270 + lVar6;
    sVar11 = context;
    if (local_270 < context) {
      sVar11 = local_270;
    }
    if (context < uVar4) {
      uVar4 = context;
    }
    hunk.left_start_ = local_270 + (1 - uVar4);
    local_268 = local_268 + lVar6;
    hunk.right_start_ = (1 - uVar4) + local_268;
    hunk.adds_ = 0;
    hunk.removes_ = 0;
    hunk.common_ = 0;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = 0;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&hunk.hunk_adds_;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = 0;
    hunk.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&hunk.hunk_removes_;
    hunk.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = 0;
    lVar8 = lVar8 + uVar4 * -0x20;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar2;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         hunk.hunk_adds_.
         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    hunk.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         hunk.hunk_removes_.
         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    while (bVar12 = sVar11 != 0, sVar11 = sVar11 - 1, bVar12) {
      anon_unknown_1::Hunk::PushLine
                (&hunk,' ',
                 *(char **)((long)&(((left->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                           + lVar8));
      lVar8 = lVar8 + 0x20;
    }
    lVar6 = uVar10 * 4;
    uVar7 = 0;
    for (; uVar10 < (ulong)((long)edits.
                                  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)edits.
                                  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 2);
        uVar10 = uVar10 + 1) {
      lVar6 = (lVar6 << 0x1e) >> 0x1e;
      lVar8 = lVar6;
      if (context <= uVar7) {
        while( true ) {
          pEVar1 = (pointer)((long)edits.
                                   super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar8);
          if (pEVar1 == edits.
                        super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00114c5a;
          if (*pEVar1 != kMatch) break;
          lVar8 = lVar8 + 4;
        }
        if ((pEVar1 == edits.
                       super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                       ._M_impl.super__Vector_impl_data._M_finish) ||
           (context <= (lVar8 >> 2) - uVar10)) break;
      }
      EVar3 = edits.
              super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar10];
      uVar7 = uVar7 + 1;
      if (EVar3 != kMatch) {
        uVar7 = 0;
      }
      if ((EVar3 < 4) && (EVar3 != kAdd)) {
        edit = '-';
        if (EVar3 == kMatch) {
          edit = ' ';
        }
        anon_unknown_1::Hunk::PushLine
                  (&hunk,edit,
                   (left->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[local_270]._M_dataplus._M_p);
      }
      if ((EVar3 & ~kRemove) == kAdd) {
        anon_unknown_1::Hunk::PushLine
                  (&hunk,'+',
                   (right->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[local_268]._M_dataplus._M_p);
      }
      local_270 = local_270 + (EVar3 != kAdd);
      local_268 = local_268 + (ulong)(EVar3 != kRemove);
      lVar6 = lVar6 + 4;
    }
LAB_00114c5a:
    if (hunk.removes_ == 0 && hunk.adds_ == 0) {
      anon_unknown_1::Hunk::~Hunk(&hunk);
      goto LAB_00114da1;
    }
    std::operator<<(local_1a8,"@@ ");
    if (hunk.removes_ != 0) {
      poVar5 = std::operator<<(local_1a8,"-");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,",");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      if (hunk.adds_ != 0 && hunk.removes_ != 0) {
        std::operator<<(local_1a8," ");
      }
    }
    if (hunk.adds_ != 0) {
      poVar5 = std::operator<<(local_1a8,"+");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,",");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    }
    std::operator<<(local_1a8," @@\n");
    anon_unknown_1::Hunk::FlushEdits(&hunk);
    p_Var9 = (_List_node_base *)plVar2;
    while (p_Var9 = (((_List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                       *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var9 != (_List_node_base *)plVar2) {
      poVar5 = std::operator<<(local_1a8,*(char *)&p_Var9[1]._M_next);
      poVar5 = std::operator<<(poVar5,(char *)p_Var9[1]._M_prev);
      std::operator<<(poVar5,"\n");
    }
    anon_unknown_1::Hunk::~Hunk(&hunk);
  } while( true );
}

Assistant:

std::string CreateUnifiedDiff(const std::vector<std::string>& left,
                              const std::vector<std::string>& right,
                              size_t context) {
  const std::vector<EditType> edits = CalculateOptimalEdits(left, right);

  size_t l_i = 0, r_i = 0, edit_i = 0;
  std::stringstream ss;
  while (edit_i < edits.size()) {
    // Find first edit.
    while (edit_i < edits.size() && edits[edit_i] == kMatch) {
      ++l_i;
      ++r_i;
      ++edit_i;
    }

    // Find the first line to include in the hunk.
    const size_t prefix_context = std::min(l_i, context);
    Hunk hunk(l_i - prefix_context + 1, r_i - prefix_context + 1);
    for (size_t i = prefix_context; i > 0; --i) {
      hunk.PushLine(' ', left[l_i - i].c_str());
    }

    // Iterate the edits until we found enough suffix for the hunk or the input
    // is over.
    size_t n_suffix = 0;
    for (; edit_i < edits.size(); ++edit_i) {
      if (n_suffix >= context) {
        // Continue only if the next hunk is very close.
        auto it = edits.begin() + static_cast<int>(edit_i);
        while (it != edits.end() && *it == kMatch) ++it;
        if (it == edits.end() ||
            static_cast<size_t>(it - edits.begin()) - edit_i >= context) {
          // There is no next edit or it is too far away.
          break;
        }
      }

      EditType edit = edits[edit_i];
      // Reset count when a non match is found.
      n_suffix = edit == kMatch ? n_suffix + 1 : 0;

      if (edit == kMatch || edit == kRemove || edit == kReplace) {
        hunk.PushLine(edit == kMatch ? ' ' : '-', left[l_i].c_str());
      }
      if (edit == kAdd || edit == kReplace) {
        hunk.PushLine('+', right[r_i].c_str());
      }

      // Advance indices, depending on edit type.
      l_i += edit != kAdd;
      r_i += edit != kRemove;
    }

    if (!hunk.has_edits()) {
      // We are done. We don't want this hunk.
      break;
    }

    hunk.PrintTo(&ss);
  }
  return ss.str();
}